

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::RegularExpression::doTokenOverlap(RegularExpression *this,Op *op,Token *token)

{
  MemoryManager *this_00;
  bool bVar1;
  opType oVar2;
  int iVar3;
  tokType tVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint local_94;
  XMLInt32 ch;
  RuntimeException *anon_var_0;
  undefined1 local_78 [8];
  RangeToken tempRange;
  RangeToken *t1;
  Token *token_local;
  Op *op_local;
  RegularExpression *this_local;
  
  oVar2 = Op::getOpType(op);
  if (oVar2 == O_RANGE) {
    iVar3 = (*op->_vptr_Op[7])();
    tempRange.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar3);
    tVar4 = Token::getTokenType(token);
    this_00 = tempRange.fMemoryManager;
    if (tVar4 == T_CHAR) {
      iVar3 = (*token->_vptr_Token[9])();
      bVar1 = RangeToken::match((RangeToken *)this_00,iVar3);
      return bVar1;
    }
    if (tVar4 != T_RANGE) {
      if (tVar4 != T_STRING) {
        return true;
      }
      iVar3 = (*token->_vptr_Token[8])();
      bVar1 = RangeToken::match((RangeToken *)this_00,
                                (uint)*(ushort *)CONCAT44(extraout_var_00,iVar3));
      return bVar1;
    }
    tVar4 = Token::getTokenType((Token *)tempRange.fMemoryManager);
    RangeToken::RangeToken((RangeToken *)local_78,tVar4,this->fMemoryManager);
    RangeToken::mergeRanges((RangeToken *)local_78,(Token *)tempRange.fMemoryManager);
    RangeToken::intersectRanges((RangeToken *)local_78,(RangeToken *)token);
    bVar1 = RangeToken::empty((RangeToken *)local_78);
    RangeToken::~RangeToken((RangeToken *)local_78);
    return (bool)((bVar1 ^ 0xffU) & 1);
  }
  local_94 = 0;
  oVar2 = Op::getOpType(op);
  if (oVar2 == O_CHAR) {
    local_94 = (*op->_vptr_Op[2])();
  }
  else {
    oVar2 = Op::getOpType(op);
    if (oVar2 == O_STRING) {
      iVar3 = (*op->_vptr_Op[8])();
      local_94 = (uint)*(ushort *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  if (local_94 != 0) {
    tVar4 = Token::getTokenType(token);
    if (tVar4 == T_CHAR) {
      uVar5 = (*token->_vptr_Token[9])();
      return uVar5 == local_94;
    }
    if (tVar4 - T_RANGE < 2) {
      bVar1 = RangeToken::match((RangeToken *)token,local_94);
      return bVar1;
    }
    if (tVar4 == T_STRING) {
      iVar3 = (*token->_vptr_Token[8])();
      return *(ushort *)CONCAT44(extraout_var_02,iVar3) == local_94;
    }
  }
  return true;
}

Assistant:

bool RegularExpression::doTokenOverlap(const Op* op, Token* token)
{
    if(op->getOpType()==Op::O_RANGE)
    {
        RangeToken* t1=(RangeToken*)op->getToken();
        switch(token->getTokenType())
        {
        case Token::T_CHAR:
            return t1->match(token->getChar());
        case Token::T_STRING:
            return t1->match(*token->getString());
        case Token::T_RANGE:
            {
                try
                {
                    RangeToken tempRange(t1->getTokenType(), fMemoryManager);
                    tempRange.mergeRanges(t1);
                    tempRange.intersectRanges((RangeToken*)token);
                    return !tempRange.empty();
                }
                catch(RuntimeException&)
                {
                }
                break;
            }
        default:
            break;
        }
        return true;
    }

    XMLInt32 ch=0;
    if(op->getOpType()==Op::O_CHAR)
        ch=op->getData();
    else if(op->getOpType()==Op::O_STRING)
        ch=*op->getLiteral();

    if(ch!=0)
    {
        switch(token->getTokenType())
        {
        case Token::T_CHAR:
            return token->getChar()==ch;
        case Token::T_STRING:
            return *token->getString()==ch;
        case Token::T_RANGE:
        case Token::T_NRANGE:
            return ((RangeToken*)token)->match(ch);
        default:
            break;
        }
    }
    // in any other case, there is the chance that they overlap
    return true;
}